

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tconcat(lua_State *L)

{
  char *s;
  size_t local_2050;
  lua_Integer i;
  char *sep;
  size_t lsep;
  lua_Integer last;
  luaL_Buffer b;
  lua_State *L_local;
  
  b.initb._8184_8_ = L;
  checktab(L,1,5);
  lsep = luaL_len((lua_State *)b.initb._8184_8_,1);
  s = luaL_optlstring((lua_State *)b.initb._8184_8_,2,"",(size_t *)&sep);
  local_2050 = luaL_optinteger((lua_State *)b.initb._8184_8_,3,1);
  lsep = luaL_optinteger((lua_State *)b.initb._8184_8_,4,lsep);
  luaL_buffinit((lua_State *)b.initb._8184_8_,(luaL_Buffer *)&last);
  for (; (long)local_2050 < (long)lsep; local_2050 = local_2050 + 1) {
    addfield((lua_State *)b.initb._8184_8_,(luaL_Buffer *)&last,local_2050);
    luaL_addlstring((luaL_Buffer *)&last,s,(size_t)sep);
  }
  if (local_2050 == lsep) {
    addfield((lua_State *)b.initb._8184_8_,(luaL_Buffer *)&last,local_2050);
  }
  luaL_pushresult((luaL_Buffer *)&last);
  return 1;
}

Assistant:

static int tconcat (lua_State *L) {
  luaL_Buffer b;
  lua_Integer last = aux_getn(L, 1, TAB_R);
  size_t lsep;
  const char *sep = luaL_optlstring(L, 2, "", &lsep);
  lua_Integer i = luaL_optinteger(L, 3, 1);
  last = luaL_optinteger(L, 4, last);
  luaL_buffinit(L, &b);
  for (; i < last; i++) {
    addfield(L, &b, i);
    luaL_addlstring(&b, sep, lsep);
  }
  if (i == last)  /* add last value (if interval was not empty) */
    addfield(L, &b, i);
  luaL_pushresult(&b);
  return 1;
}